

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::OurReader::decodeNumber(OurReader *this,Token *token,Value *decoded)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  uint uVar5;
  ulong uVar6;
  ValueType type;
  ValueHolder VVar7;
  byte *pbVar8;
  bool bVar9;
  ValueHolder local_58 [2];
  undefined8 local_48;
  char *pcVar4;
  
  pcVar4 = token->start_;
  cVar1 = *pcVar4;
  bVar9 = cVar1 == '-';
  uVar6 = 0x1999999999999999;
  if (bVar9) {
    uVar6 = 0xccccccccccccccc;
  }
  pbVar8 = (byte *)(pcVar4 + bVar9);
  VVar7.int_ = 0;
  do {
    if (token->end_ <= pbVar8) {
      if (cVar1 == '-') {
        VVar7.int_ = -VVar7.int_;
LAB_0010c794:
        type = intValue;
      }
      else {
        if (-1 < VVar7.int_) goto LAB_0010c794;
        type = uintValue;
      }
      local_48 = 0;
      Value::initBasic((Value *)local_58,type,false);
      local_58[0] = VVar7;
      Value::swap((Value *)local_58,decoded);
      Value::~Value((Value *)local_58);
      bVar3 = 1;
      break;
    }
    bVar3 = *pbVar8;
    pbVar8 = pbVar8 + 1;
    if (((byte)(bVar3 - 0x3a) < 0xf6) ||
       ((uVar5 = bVar3 - 0x30, uVar6 <= VVar7.uint_ &&
        (((uVar6 < VVar7.uint_ || (pbVar8 != (byte *)token->end_)) || ((uint)bVar9 * 3 + 5 < uVar5))
        )))) {
      bVar2 = decodeDouble(this,token,decoded);
      pcVar4 = (char *)(ulong)bVar2;
      bVar2 = false;
    }
    else {
      VVar7.string_ = (char *)((ulong)uVar5 + VVar7.int_ * 10);
      bVar2 = true;
    }
    bVar3 = (byte)pcVar4;
  } while (bVar2);
  return (bool)(bVar3 & 1);
}

Assistant:

bool OurReader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  const bool isNegative = *current == '-';
  if (isNegative) {
    ++current;
  }

  // We assume we can represent the largest and smallest integer types as
  // unsigned integers with separate sign. This is only true if they can fit
  // into an unsigned integer.
  static_assert(Value::maxLargestInt <= Value::maxLargestUInt,
                "Int must be smaller than UInt");

  // We need to convert minLargestInt into a positive number. The easiest way
  // to do this conversion is to assume our "threshold" value of minLargestInt
  // divided by 10 can fit in maxLargestInt when absolute valued. This should
  // be a safe assumption.
  static_assert(Value::minLargestInt <= -Value::maxLargestInt,
                "The absolute value of minLargestInt must be greater than or "
                "equal to maxLargestInt");
  static_assert(Value::minLargestInt / 10 >= -Value::maxLargestInt,
                "The absolute value of minLargestInt must be only 1 magnitude "
                "larger than maxLargest Int");

  static constexpr Value::LargestUInt positive_threshold =
      Value::maxLargestUInt / 10;
  static constexpr Value::UInt positive_last_digit = Value::maxLargestUInt % 10;

  // For the negative values, we have to be more careful. Since typically
  // -Value::minLargestInt will cause an overflow, we first divide by 10 and
  // then take the inverse. This assumes that minLargestInt is only a single
  // power of 10 different in magnitude, which we check above. For the last
  // digit, we take the modulus before negating for the same reason.
  static constexpr auto negative_threshold =
      Value::LargestUInt(-(Value::minLargestInt / 10));
  static constexpr auto negative_last_digit =
      Value::UInt(-(Value::minLargestInt % 10));

  const Value::LargestUInt threshold =
      isNegative ? negative_threshold : positive_threshold;
  const Value::UInt max_last_digit =
      isNegative ? negative_last_digit : positive_last_digit;

  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);

    const auto digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, meaing value == threshold,
      // b) this is the last digit, or
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > max_last_digit) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }

  if (isNegative) {
    // We use the same magnitude assumption here, just in case.
    const auto last_digit = static_cast<Value::UInt>(value % 10);
    decoded = -Value::LargestInt(value / 10) * 10 - last_digit;
  } else if (value <= Value::LargestUInt(Value::maxLargestInt)) {
    decoded = Value::LargestInt(value);
  } else {
    decoded = value;
  }

  return true;
}